

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O1

void __thiscall SubcommandProgram_CaseCheck_Test::TestBody(SubcommandProgram_CaseCheck_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [16];
  AssertHelper local_28;
  
  local_48[0].ptr_ = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Start","");
  piVar1 = &(this->super_SubcommandProgram).super_TApp.args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_48,
             &local_28);
  if (local_48[0].ptr_ != local_38) {
    operator_delete(local_48[0].ptr_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run((TApp *)this);
  }
  testing::Message::Message((Message *)local_48);
  testing::internal::AssertHelper::AssertHelper
            (&local_28,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x1ea,
             "Expected: run() throws an exception of type CLI::ExtrasError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_28,(Message *)local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_28);
  if (local_48[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_48[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_48[0].ptr_ + 8))();
    }
    local_48[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  this_00 = &(this->super_SubcommandProgram).super_TApp.app;
  CLI::App::reset(this_00);
  local_48[0].ptr_ = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"start","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_48,
             &local_28);
  if (local_48[0].ptr_ != local_38) {
    operator_delete(local_48[0].ptr_);
  }
  TApp::run((TApp *)this);
  CLI::App::reset(this_00);
  CLI::App::ignore_case((this->super_SubcommandProgram).start,true);
  TApp::run((TApp *)this);
  CLI::App::reset(this_00);
  local_48[0].ptr_ = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Start","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_48,
             &local_28);
  if (local_48[0].ptr_ != local_38) {
    operator_delete(local_48[0].ptr_);
  }
  TApp::run((TApp *)this);
  return;
}

Assistant:

TEST_F(SubcommandProgram, CaseCheck) {
    args = {"Start"};
    EXPECT_THROW(run(), CLI::ExtrasError);

    app.reset();
    args = {"start"};
    run();

    app.reset();
    start->ignore_case();
    run();

    app.reset();
    args = {"Start"};
    run();
}